

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
FactoredDecPOMDPDiscrete::SetScopeForLRF
          (FactoredDecPOMDPDiscrete *this,Index LRF,Scope *X,Scope *A,Scope *Y,Scope *O)

{
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Scope Abackedup;
  Scope Xbackedup;
  Scope *in_stack_ffffffffffffff98;
  Scope *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  Index in_stack_ffffffffffffffac;
  FactoredDecPOMDPDiscrete *in_stack_ffffffffffffffb0;
  undefined1 local_48 [24];
  undefined8 local_30;
  undefined8 local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  (**(code **)(*in_RDI + 0x1b0))(local_48,in_RDI,in_R8,in_R9);
  (**(code **)(*in_RDI + 0x1b8))(&stack0xffffffffffffffa0,in_RDI,local_28,local_30);
  Scope::Insert((Scope *)in_stack_ffffffffffffffb0,
                (Scope *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  Scope::Sort(in_stack_ffffffffffffffa0);
  Scope::Insert((Scope *)in_stack_ffffffffffffffb0,
                (Scope *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  Scope::Sort(in_stack_ffffffffffffffa0);
  SetScopeForLRF(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
  Scope::~Scope((Scope *)0xadea83);
  Scope::~Scope((Scope *)0xadea8d);
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::SetScopeForLRF(Index LRF, 
            const Scope& X, //the X scope
            const Scope& A, //the A scope
            const Scope& Y,
            const Scope& O
        )
{
    Scope Xbackedup = StateScopeBackup( Y, O);
    Scope Abackedup = AgentScopeBackup( Y, O);
    // X'' = X' + X
    Xbackedup.Insert(X);
    Xbackedup.Sort();
    // A'' = A' + A
    Abackedup.Insert(A);
    Abackedup.Sort();
    SetScopeForLRF(LRF, Xbackedup, Abackedup);
}